

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_out_of_log_msg
          (raft_server *this,req_msg *req,ptr<custom_notification_msg> *msg,ptr<resp_msg> *resp)

{
  pointer psVar1;
  undefined8 uVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  int iVar8;
  undefined8 *in_R8;
  ptr<out_of_log_msg> pVar9;
  ptr<resp_msg> pVar10;
  ptr<out_of_log_msg> ool_msg;
  OutOfLogRangeWarningArgs args;
  out_of_log_msg local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string local_70;
  raft_server *local_50;
  undefined4 local_44;
  undefined8 local_40;
  string *local_38;
  
  if (handle_out_of_log_msg(nuraft::req_msg&,std::shared_ptr<nuraft::custom_notification_msg>,std::shared_ptr<nuraft::resp_msg>)
      ::msg_timer == '\0') {
    iVar5 = __cxa_guard_acquire(&handle_out_of_log_msg(nuraft::req_msg&,std::shared_ptr<nuraft::custom_notification_msg>,std::shared_ptr<nuraft::resp_msg>)
                                 ::msg_timer);
    if (iVar5 != 0) {
      handle_out_of_log_msg::msg_timer.t_created_.__d.__r = (duration)0;
      handle_out_of_log_msg::msg_timer.duration_us_ = (size_t)::__func___0;
      handle_out_of_log_msg::msg_timer.first_event_fired_ = true;
      handle_out_of_log_msg::msg_timer.lock_.super___mutex_base._M_mutex.__align = 0;
      handle_out_of_log_msg::msg_timer.lock_.super___mutex_base._M_mutex._8_8_ = 0;
      handle_out_of_log_msg::msg_timer.lock_.super___mutex_base._M_mutex._16_8_ = 0;
      handle_out_of_log_msg::msg_timer.lock_.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      handle_out_of_log_msg::msg_timer.lock_.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      timer_helper::reset(&handle_out_of_log_msg::msg_timer);
      __cxa_guard_release(&handle_out_of_log_msg(nuraft::req_msg&,std::shared_ptr<nuraft::custom_notification_msg>,std::shared_ptr<nuraft::resp_msg>)
                           ::msg_timer);
    }
  }
  bVar4 = timer_helper::timeout_and_reset(&handle_out_of_log_msg::msg_timer);
  update_term((raft_server *)req,
              (ulong)(msg->
                     super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>
                     )._M_refcount._M_pi);
  LOCK();
  *(undefined1 *)
   ((long)&req[2].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 3) = 1;
  UNLOCK();
  pVar9 = out_of_log_msg::deserialize
                    (&local_80,
                     (buffer *)
                     (((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_msg_base).term_);
  _Var7 = pVar9.super___shared_ptr<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  psVar1 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (psVar1 != (pointer)0x0) {
    iVar5 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    iVar8 = (uint)!bVar4 + (uint)!bVar4 * 2 + 3;
    _Var7._M_pi = extraout_RDX;
    if (iVar8 <= iVar5) {
      psVar1 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      uVar2 = *(undefined8 *)local_80.start_idx_of_leader_;
      local_50 = this;
      lVar6 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      msg_if_given_abi_cxx11_
                (&local_70,
                 "this node is out of log range. leader\'s start index: %lu, my last index: %lu",
                 uVar2,lVar6 + -1);
      (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar1,iVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                        ,"handle_out_of_log_msg",0xc2,&local_70);
      this = local_50;
      _Var7._M_pi = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_));
        _Var7._M_pi = extraout_RDX_01;
      }
    }
  }
  if (((msg->super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi ==
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)req[9].super_msg_base._vptr_msg_base[1]) &&
     (*(int *)&req[8].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage == 1)) {
    restart_election_timer((raft_server *)req);
    _Var7._M_pi = extraout_RDX_02;
  }
  local_70._M_dataplus._M_p._0_4_ =
       *(undefined4 *)
        &(req->log_entries_).
         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_70._M_dataplus._M_p._4_4_ = *(undefined4 *)((long)&req->commit_idx_ + 4);
  local_70._M_string_length._0_4_ = 0xffffffff;
  local_40 = *(undefined8 *)local_80.start_idx_of_leader_;
  local_70.field_2._M_allocated_capacity = (size_type)&local_40;
  lVar6 = *(long *)&req[4].super_msg_base.dst_;
  if (*(long *)(lVar6 + 0x80) != 0) {
    local_44 = 0xf;
    local_38 = &local_70;
    (**(code **)(lVar6 + 0x88))(lVar6 + 0x70);
    _Var7._M_pi = extraout_RDX_03;
  }
  peVar3 = (element_type *)in_R8[1];
  in_R8[1] = 0;
  this->_vptr_raft_server = (_func_int **)*in_R8;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  *in_R8 = 0;
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    _Var7._M_pi = extraout_RDX_04;
  }
  pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_out_of_log_msg(req_msg& req,
                                                 ptr<custom_notification_msg> msg,
                                                 ptr<resp_msg> resp)
{
    static timer_helper msg_timer(5000000);
    int log_lv = msg_timer.timeout_and_reset() ? L_WARN : L_TRACE;

    // As it is a special form of heartbeat, need to update term.
    update_term(req.get_term());

    out_of_log_range_ = true;

    ptr<out_of_log_msg> ool_msg = out_of_log_msg::deserialize(*msg->ctx_);
    p_lv(log_lv, "this node is out of log range. leader's start index: %" PRIu64 ", "
         "my last index: %" PRIu64,
         ool_msg->start_idx_of_leader_,
         log_store_->next_slot() - 1);

    // Should restart election timer to avoid initiating false vote.
    if ( req.get_term() == state_->get_term() &&
         role_ == srv_role::follower ) {
        restart_election_timer();
    }

    cb_func::Param param(id_, leader_);
    cb_func::OutOfLogRangeWarningArgs args(ool_msg->start_idx_of_leader_);
    param.ctx = &args;
    ctx_->cb_func_.call(cb_func::OutOfLogRangeWarning, &param);

    return resp;
}